

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O0

bool __thiscall pbrt::SimplePrimitive::IntersectP(SimplePrimitive *this,Ray *r,Float tMax)

{
  bool bVar1;
  long in_RDI;
  undefined4 in_XMM0_Da;
  ShapeHandle *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe0;
  Float tMax_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RDI + 8));
  tMax_00 = (Float)((ulong)in_RDI >> 0x20);
  if ((bVar1) &&
     (bVar1 = MaterialHandle::IsTransparent
                        ((MaterialHandle *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0)), bVar1))
  {
    bVar1 = false;
  }
  else {
    bVar1 = ShapeHandle::IntersectP
                      (unaff_retaddr,
                       (Ray *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),tMax_00)
    ;
  }
  return bVar1;
}

Assistant:

bool SimplePrimitive::IntersectP(const Ray &r, Float tMax) const {
    if (material && material.IsTransparent())
        return false;
    return shape.IntersectP(r, tMax);
}